

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDEdge::AddFaceToArray(ON_SubDEdge *this,ON_SubDFacePtr face_ptr)

{
  ushort uVar1;
  ON_SubDFacePtr *pOVar2;
  uint uVar3;
  
  uVar1 = this->m_face_count;
  if (uVar1 < 2) {
    pOVar2 = this->m_face2 + uVar1;
  }
  else {
    if ((this->m_facex == (ON_SubDFacePtr *)0x0) ||
       (uVar3 = this->m_facex_capacity + 2, uVar3 < uVar1 || uVar3 == uVar1)) {
      ON_SubDIncrementErrorCount();
      return false;
    }
    pOVar2 = this->m_facex + ((ulong)uVar1 - 2);
  }
  pOVar2->m_ptr = face_ptr.m_ptr;
  this->m_face_count = uVar1 + 1;
  return true;
}

Assistant:

bool ON_SubDEdge::AddFaceToArray(
  ON_SubDFacePtr face_ptr
)
{
  if (m_face_count < 2)
    m_face2[m_face_count] = face_ptr;
  else if (nullptr != m_facex && m_face_count < 2 + m_facex_capacity)
    m_facex[m_face_count - 2] = face_ptr;
  else
  {
    // not enough room in m_facex.
    // If you really are trying to make a non-manifold subd, 
    // then use ON_SubD::GrowEdgeFaceArray().
    return ON_SUBD_RETURN_ERROR(false);
  }
  m_face_count++;
  return true;
}